

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_pipelines.cpp
# Opt level: O3

int ifelse_pipe_ans(int a)

{
  int iVar1;
  int iVar2;
  
  iVar2 = a + 8;
  if (a + 1U < 3) {
    iVar2 = a;
  }
  iVar1 = iVar2 + -0x72a;
  if (iVar2 < 0x1322) {
    iVar1 = iVar2 + 3;
  }
  return (uint)(0xbe < iVar1) * 0x10 + iVar1 + 1;
}

Assistant:

int ifelse_pipe_ans(int a) {
  // pipe 1
  if(a / 2 != 0) {
    a += 8;
  }
  // pipe 2
  if(a > 4897) {
    a -= 1834;
  }
  else {
    a += 3;
  }
  // pipe 3
  if((a + 9) / 4 < 50) {
    a += 1;
  }
  else {
    a += 17;
  }

  return a;
}